

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::toString(QLocale *this,QDateTime *dateTime,FormatType format)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *pQVar3;
  int in_ECX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString format_str;
  QVariant res;
  QVariant *in_stack_ffffffffffffff18;
  QVariant *in_stack_ffffffffffffff20;
  QVariant *in_stack_ffffffffffffff28;
  QString *in_stack_ffffffffffffff48;
  QString *this_00;
  FormatType in_stack_ffffffffffffff6c;
  QLocale *in_stack_ffffffffffffff70;
  QString local_48;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QDateTime::isValid((QDateTime *)in_stack_ffffffffffffff20);
  if (bVar1) {
    pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4cebcd);
    if (pQVar2->m_data == &systemLocaleData) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = systemLocale();
      in_stack_ffffffffffffff48 = &local_48;
      ::QVariant::QVariant(in_stack_ffffffffffffff20,(QDateTime *)in_stack_ffffffffffffff18);
      (*pQVar3->_vptr_QSystemLocale[2])
                (&local_28,pQVar3,(ulong)(0x18 - (in_ECX == 0)),in_stack_ffffffffffffff48);
      ::QVariant::~QVariant(in_stack_ffffffffffffff20);
      bVar1 = ::QVariant::isNull(in_stack_ffffffffffffff28);
      if (!bVar1) {
        ::QVariant::toString(in_stack_ffffffffffffff18);
      }
      ::QVariant::~QVariant(in_stack_ffffffffffffff20);
      if (!bVar1) goto LAB_004ced95;
    }
    dateTimeFormat(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    toString((QLocale *)this_00,(QDateTime *)in_RDI,in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x4ced72);
  }
  else {
    QString::QString((QString *)0x4cebbe);
  }
LAB_004ced95:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QString QLocale::toString(const QDateTime &dateTime, FormatType format) const
{
    if (!dateTime.isValid())
        return QString();

#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateTimeToStringLong
                                             : QSystemLocale::DateTimeToStringShort,
                                             dateTime);
        if (!res.isNull())
            return res.toString();
    }
#endif

    const QString format_str = dateTimeFormat(format);
    return toString(dateTime, format_str);
}